

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

TParameter * __thiscall glslang::TParameter::copyParam(TParameter *this,TParameter *param)

{
  int iVar1;
  char *s;
  undefined4 extraout_var;
  TString *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  TParameter *pTVar2;
  void *in_R8;
  TParameter *param_local;
  TParameter *this_local;
  
  pTVar2 = param;
  if (param->name == (TString *)0x0) {
    this->name = (TString *)0x0;
  }
  else {
    s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str(param->name);
    in_RCX = NewPoolTString_abi_cxx11_(s);
    this->name = in_RCX;
    in_RDX = extraout_RDX;
  }
  iVar1 = TType::clone(param->type,(__fn *)pTVar2,in_RDX,(int)in_RCX,in_R8);
  this->type = (TType *)CONCAT44(extraout_var,iVar1);
  this->defaultValue = param->defaultValue;
  return this;
}

Assistant:

TParameter& copyParam(const TParameter& param)
    {
        if (param.name)
            name = NewPoolTString(param.name->c_str());
        else
            name = nullptr;
        type = param.type->clone();
        defaultValue = param.defaultValue;
        return *this;
    }